

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModel.cpp
# Opt level: O1

void __thiscall
chrono::collision::ChCollisionModel::ArchiveOUT(ChCollisionModel *this,ChArchiveOut *marchive)

{
  char *local_38;
  float *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::collision::ChCollisionModel>(marchive);
  local_30 = &this->model_envelope;
  local_38 = "model_envelope";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_38);
  local_30 = &this->model_safe_margin;
  local_38 = "model_safe_margin";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_38);
  return;
}

Assistant:

void ChCollisionModel::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChCollisionModel>();

    // serialize all member data:
    marchive << CHNVP(model_envelope);
    marchive << CHNVP(model_safe_margin);
}